

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_projection2.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ALLEGRO_BITMAP *pAVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 extraout_RAX;
  long lVar13;
  char *pcVar14;
  bool bVar15;
  char *unaff_R14;
  float fVar16;
  float fVar17;
  float in_XMM3_Da;
  ALLEGRO_EVENT event;
  undefined1 auStack_100 [64];
  code *pcStack_c0;
  uint local_ac;
  float local_a8;
  uint local_a4;
  ALLEGRO_BITMAP *local_a0;
  ALLEGRO_BITMAP *local_98;
  undefined8 local_90;
  undefined8 local_88;
  ALLEGRO_BITMAP *local_80;
  int local_78 [8];
  int local_58;
  
  lVar13 = 0x10;
  if (1 < argc) {
    unaff_R14 = argv[1];
    pcStack_c0 = (code *)0x1025e0;
    iVar6 = strcmp(unaff_R14,"--use-shaders");
    lVar13 = 0x810;
    if (iVar6 != 0) goto LAB_00102a79;
  }
  pcStack_c0 = (code *)0x1025fe;
  cVar5 = al_install_system(0x5020700,atexit);
  if (cVar5 == '\0') {
    pcVar14 = "Could not init Allegro.\n";
  }
  else {
    pcStack_c0 = (code *)0x10260b;
    al_init_image_addon();
    pcStack_c0 = (code *)0x102610;
    al_init_primitives_addon();
    pcStack_c0 = (code *)0x102615;
    al_init_font_addon();
    pcStack_c0 = (code *)0x10261a;
    al_install_keyboard();
    pcStack_c0 = (code *)0x102621;
    al_set_new_display_flags(lVar13);
    pcStack_c0 = (code *)0x102635;
    al_set_new_display_option(0xf,0x10,2);
    pcStack_c0 = (code *)0x102646;
    al_set_new_display_option(0x1c,0,1);
    pcStack_c0 = (code *)0x102655;
    lVar8 = al_create_display(800,600);
    if (lVar8 == 0) {
      pcVar14 = "Error creating display\n";
    }
    else {
      pcStack_c0 = (code *)0x102678;
      al_set_window_constraints(lVar8,0x100,0x200,0,0);
      pcStack_c0 = (code *)0x102685;
      al_apply_window_constraints(lVar8,1);
      pcStack_c0 = (code *)0x10268d;
      pAVar9 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar8);
      pcStack_c0 = (code *)0x102695;
      set_perspective_transform(pAVar9);
      pcStack_c0 = (code *)0x10269d;
      uVar10 = al_get_backbuffer(lVar8);
      pcStack_c0 = (code *)0x1026b4;
      local_80 = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar10,0,0,0x100,0x100);
      pcStack_c0 = (code *)0x1026c1;
      set_perspective_transform(local_80);
      pcStack_c0 = (code *)0x1026c9;
      uVar10 = al_get_backbuffer(lVar8);
      pcStack_c0 = (code *)0x1026e0;
      local_88 = al_create_sub_bitmap(uVar10,0,0,0x100,0x200);
      pcStack_c0 = (code *)0x1026f4;
      local_a0 = (ALLEGRO_BITMAP *)al_create_bitmap(200,200);
      pcStack_c0 = (code *)0x102701;
      set_perspective_transform(local_a0);
      pcStack_c0 = (code *)0x10270e;
      uVar10 = al_create_timer(0x11111111);
      pcStack_c0 = (code *)0x102716;
      local_90 = al_create_builtin_font();
      pcStack_c0 = (code *)0x102720;
      uVar11 = al_create_event_queue();
      pcStack_c0 = (code *)0x102728;
      uVar12 = al_get_keyboard_event_source();
      pcStack_c0 = (code *)0x102733;
      al_register_event_source(uVar11,uVar12);
      pcStack_c0 = (code *)0x10273b;
      uVar12 = al_get_display_event_source(lVar8);
      pcStack_c0 = (code *)0x102746;
      al_register_event_source(uVar11,uVar12);
      pcStack_c0 = (code *)0x10274e;
      uVar12 = al_get_timer_event_source(uVar10);
      pcStack_c0 = (code *)0x102759;
      al_register_event_source(uVar11,uVar12);
      pcStack_c0 = (code *)0x102763;
      al_set_new_bitmap_flags(0x1c0);
      pcStack_c0 = (code *)0x10276f;
      local_98 = (ALLEGRO_BITMAP *)al_load_bitmap("data/bkg.png");
      if (local_98 != (ALLEGRO_BITMAP *)0x0) {
        pcStack_c0 = (code *)0x102785;
        al_start_timer(uVar10);
        local_a8 = 0.0;
        local_ac = 0;
        local_a4 = 0;
        bVar15 = false;
        do {
          while( true ) {
            pcStack_c0 = (code *)0x1027b3;
            al_wait_for_event(uVar11,local_78);
            if (local_78[0] != 0x30) break;
            pcStack_c0 = (code *)0x1027c4;
            al_acknowledge_drawing_halt(lVar8);
            pcStack_c0 = (code *)0x1027cc;
            al_stop_timer(uVar10);
            bVar15 = true;
          }
          if (local_78[0] < 0x29) {
            if (local_78[0] == 10) {
              if (local_58 == 0x4b) {
                local_a4 = local_a4 ^ 1;
                pcStack_c0 = (code *)0x102893;
                al_set_display_flag(lVar8,0x200,local_a4 & 1);
LAB_00102893:
                pcStack_c0 = (code *)0x10289b;
                pAVar9 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar8);
                pcStack_c0 = (code *)0x1028a3;
                set_perspective_transform(pAVar9);
              }
              else if (local_58 == 0x3b) goto LAB_00102871;
            }
            else if (local_78[0] == 0x1e) {
              pcStack_c0 = (code *)0x102826;
              dVar1 = fmod((double)local_a8 + 0.05,6.283185307179586);
              local_a8 = (float)dVar1;
              local_ac = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
LAB_001028a3:
            bVar4 = false;
LAB_001028a5:
            bVar3 = !bVar15;
            bVar15 = true;
            if (bVar3) {
              bVar3 = bVar4;
              if ((local_ac & 1) != 0) goto LAB_001028bc;
              bVar15 = false;
              local_ac = 0;
            }
          }
          else {
            if (local_78[0] != 0x31) {
              if (local_78[0] != 0x2a) {
                if (local_78[0] == 0x29) {
                  pcStack_c0 = (code *)0x1027f5;
                  al_acknowledge_resize(lVar8);
                  goto LAB_00102893;
                }
                goto LAB_001028a3;
              }
LAB_00102871:
              bVar4 = true;
              goto LAB_001028a5;
            }
            pcStack_c0 = (code *)0x102840;
            al_acknowledge_drawing_resume(lVar8);
            pcStack_c0 = (code *)0x102848;
            al_start_timer(uVar10);
            bVar4 = false;
            bVar15 = false;
            uVar2 = local_ac & 1;
            local_ac = 0;
            bVar3 = false;
            if (uVar2 != 0) {
LAB_001028bc:
              bVar4 = bVar3;
              pcStack_c0 = (code *)0x1028c4;
              uVar12 = al_is_event_queue_empty(uVar11);
              if ((char)uVar12 == '\0') {
                local_ac = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),1);
                bVar15 = false;
              }
              else {
                pcStack_c0 = (code *)0x1028d4;
                al_set_target_backbuffer(lVar8);
                pcStack_c0 = (code *)0x1028e3;
                al_set_render_state(0x12,1);
                fVar16 = 0.0;
                fVar17 = 0.0;
                pcStack_c0 = (code *)0x1028f1;
                al_map_rgb_f(0);
                pcStack_c0 = (code *)0x1028f6;
                al_clear_to_color();
                pcStack_c0 = (code *)0x102903;
                al_clear_depth_buffer(0x447a0000);
                pAVar9 = local_98;
                pcStack_c0 = (code *)0x102916;
                draw_pyramid(local_98,local_a8,fVar16,fVar17,in_XMM3_Da);
                pcStack_c0 = (code *)0x102920;
                al_set_target_bitmap(local_a0);
                pcStack_c0 = (code *)0x10292f;
                al_set_render_state(0x12,1);
                fVar16 = 0.1;
                fVar17 = 0.1;
                pcStack_c0 = (code *)0x102942;
                al_map_rgb_f(0);
                pcStack_c0 = (code *)0x102947;
                al_clear_to_color();
                pcStack_c0 = (code *)0x102954;
                al_clear_depth_buffer(0x447a0000);
                pcStack_c0 = (code *)0x102962;
                draw_pyramid(pAVar9,local_a8,fVar16,fVar17,in_XMM3_Da);
                pcStack_c0 = (code *)0x10296c;
                al_set_target_bitmap(local_80);
                pcStack_c0 = (code *)0x10297b;
                al_set_render_state(0x12,1);
                fVar16 = 0.0;
                fVar17 = 0.25;
                pcStack_c0 = (code *)0x10298e;
                al_map_rgb_f(0);
                pcStack_c0 = (code *)0x102993;
                al_clear_to_color();
                pcStack_c0 = (code *)0x1029a0;
                al_clear_depth_buffer(0x447a0000);
                pcStack_c0 = (code *)0x1029ae;
                draw_pyramid(pAVar9,local_a8,fVar16,fVar17,in_XMM3_Da);
                pcStack_c0 = (code *)0x1029b8;
                al_set_target_bitmap(local_88);
                local_ac = 0;
                pcStack_c0 = (code *)0x1029cc;
                al_set_render_state(0x12,0);
                pcStack_c0 = (code *)0x1029df;
                al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
                in_XMM3_Da = 16.0;
                pcStack_c0 = (code *)0x102a05;
                al_draw_text(local_90,1,"Press Space to toggle fullscreen");
                pcStack_c0 = (code *)0x102a1c;
                al_draw_bitmap(0,local_a0,0);
                pcStack_c0 = (code *)0x102a21;
                al_flip_display();
                bVar15 = false;
              }
            }
          }
          if (bVar4) {
            return 0;
          }
        } while( true );
      }
      pcVar14 = "Could not load data/bkg.png";
      local_98 = (ALLEGRO_BITMAP *)0x0;
      lVar13 = lVar8;
    }
  }
  pcStack_c0 = (code *)0x102a79;
  abort_example(pcVar14);
LAB_00102a79:
  pcVar14 = "Unknown command line argument: %s\n";
  pcStack_c0 = set_perspective_transform;
  abort_example("Unknown command line argument: %s\n",unaff_R14);
  pcStack_c0 = (code *)lVar13;
  iVar6 = al_get_bitmap_height();
  iVar7 = al_get_bitmap_width(pcVar14);
  al_set_target_bitmap(pcVar14);
  al_identity_transform(auStack_100);
  al_perspective_transform
            (0xbf800000,(float)iVar6 / (float)iVar7,0x3f800000,0x3f800000,
             -((float)iVar6 / (float)iVar7),0x447a0000,auStack_100);
  iVar6 = al_use_projection_transform(auStack_100);
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_BITMAP *texture;
   ALLEGRO_BITMAP *display_sub_persp;
   ALLEGRO_BITMAP *display_sub_ortho;
   ALLEGRO_BITMAP *buffer;
   ALLEGRO_FONT *font;
   bool redraw = false;
   bool quit = false;
   bool fullscreen = false;
   bool background = false;
   int display_flags = ALLEGRO_RESIZABLE;
   float theta = 0;

   if (argc > 1) {
      if(strcmp(argv[1], "--use-shaders") == 0) {
         display_flags |= ALLEGRO_PROGRAMMABLE_PIPELINE;
      }
      else {
         abort_example("Unknown command line argument: %s\n", argv[1]);
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_primitives_addon();
   al_init_font_addon();
   init_platform_specific();
   al_install_keyboard();

   al_set_new_display_flags(display_flags);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   /* Load everything as a POT bitmap to make sure the projection stuff works
    * with mismatched backing texture and bitmap sizes. */
   al_set_new_display_option(ALLEGRO_SUPPORT_NPOT_BITMAP, 0, ALLEGRO_REQUIRE);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_set_window_constraints(display, 256, 512, 0, 0);
   al_apply_window_constraints(display, true);
   set_perspective_transform(al_get_backbuffer(display));

   /* This bitmap is a sub-bitmap of the display, and has a perspective transformation. */
   display_sub_persp = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 256);
   set_perspective_transform(display_sub_persp);

   /* This bitmap is a sub-bitmap of the display, and has a orthographic transformation. */
   display_sub_ortho = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 512);

   /* This bitmap has a perspective transformation, purposefully non-POT */
   buffer = al_create_bitmap(200, 200);
   set_perspective_transform(buffer);

   timer = al_create_timer(1.0 / 60);
   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR |
      ALLEGRO_MIPMAP);

   texture = al_load_bitmap("data/bkg.png");
   if (!texture) {
      abort_example("Could not load data/bkg.png");
   }

   al_start_timer(timer);
   while (!quit) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            quit = true;
            break;
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(display);
            set_perspective_transform(al_get_backbuffer(display));
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_ESCAPE:
                  quit = true;
                  break;
               case ALLEGRO_KEY_SPACE:
                  fullscreen = !fullscreen;
                  al_set_display_flag(display, ALLEGRO_FULLSCREEN_WINDOW, fullscreen);
                  set_perspective_transform(al_get_backbuffer(display));
                  break;
            }
            break;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            theta = fmod(theta + 0.05, 2 * ALLEGRO_PI);
            break;
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background = true;
            al_acknowledge_drawing_halt(display);
            al_stop_timer(timer);
            break;
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background = false;
            al_acknowledge_drawing_resume(display);
            al_start_timer(timer);
            break;
      }

      if (!background && redraw && al_is_event_queue_empty(queue)) {
         al_set_target_backbuffer(display);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(buffer);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0.1, 0.1));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_persp);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0.25));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_ortho);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 0);
         al_draw_text(font, al_map_rgb_f(1, 1, 1), 128, 16, ALLEGRO_ALIGN_CENTER,
                      "Press Space to toggle fullscreen");
         al_draw_bitmap(buffer, 0, 256, 0);

         al_flip_display();
         redraw = false;
      }
   }
   return 0;
}